

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O0

aom_codec_err_t av1_copy_reference_dec(AV1Decoder *pbi,int idx,YV12_BUFFER_CONFIG *sd)

{
  int iVar1;
  YV12_BUFFER_CONFIG *a;
  YV12_BUFFER_CONFIG *in_RDX;
  int in_ESI;
  long in_RDI;
  YV12_BUFFER_CONFIG *cfg;
  YV12_BUFFER_CONFIG *in_stack_00000008;
  int num_planes;
  AV1_COMMON *cm;
  aom_codec_err_t local_4;
  
  av1_num_planes((AV1_COMMON *)(in_RDI + 0x3b60));
  a = get_ref_frame((AV1_COMMON *)(in_RDI + 0x3b60),in_ESI);
  if (a == (YV12_BUFFER_CONFIG *)0x0) {
    aom_internal_error((aom_internal_error_info *)(in_RDI + 0x5ff08),AOM_CODEC_ERROR,
                       "No reference frame");
    local_4 = AOM_CODEC_ERROR;
  }
  else {
    iVar1 = equal_dimensions(a,in_RDX);
    if (iVar1 == 0) {
      aom_internal_error((aom_internal_error_info *)(in_RDI + 0x5ff08),AOM_CODEC_ERROR,
                         "Incorrect buffer dimensions");
    }
    else {
      aom_yv12_copy_frame_c((YV12_BUFFER_CONFIG *)cm,in_stack_00000008,cfg._4_4_);
    }
    local_4 = *(aom_codec_err_t *)(in_RDI + 0x5ff08);
  }
  return local_4;
}

Assistant:

aom_codec_err_t av1_copy_reference_dec(AV1Decoder *pbi, int idx,
                                       YV12_BUFFER_CONFIG *sd) {
  AV1_COMMON *cm = &pbi->common;
  const int num_planes = av1_num_planes(cm);

  const YV12_BUFFER_CONFIG *const cfg = get_ref_frame(cm, idx);
  if (cfg == NULL) {
    aom_internal_error(&pbi->error, AOM_CODEC_ERROR, "No reference frame");
    return AOM_CODEC_ERROR;
  }
  if (!equal_dimensions(cfg, sd))
    aom_internal_error(&pbi->error, AOM_CODEC_ERROR,
                       "Incorrect buffer dimensions");
  else
    aom_yv12_copy_frame(cfg, sd, num_planes);

  return pbi->error.error_code;
}